

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzyHammerer.cpp
# Opt level: O3

void FuzzyHammerer::probe_mapping_and_scan
               (PatternAddressMapper *mapper,Memory *memory,FuzzingParameterSet *fuzzing_params,
               size_t num_dram_locations)

{
  pointer *ppvVar1;
  FLUSHING_STRATEGY flushing;
  FENCING_STRATEGY fencing;
  iterator __position;
  size_t args;
  _Alloc_hider args_1;
  bool sync_each_ref;
  int iVar2;
  int iVar3;
  uint uVar4;
  CodeJitter *this;
  undefined4 extraout_var;
  string *psVar5;
  size_t sVar6;
  unsigned_long *puVar7;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var8;
  long lVar9;
  undefined1 auVar10 [8];
  long lVar11;
  unsigned_long args_4;
  pointer ppcVar12;
  pointer ppcVar13;
  undefined1 local_27f8 [48];
  unsigned_long auStack_27c8 [620];
  undefined1 local_1468 [8];
  mt19937 gen;
  undefined1 auStack_b8 [8];
  vector<volatile_char_*,_std::allocator<volatile_char_*>_> hammering_accesses_vec;
  long local_98;
  size_t flipped_bits;
  undefined1 auStack_88 [8];
  vector<volatile_char_*,_std::allocator<volatile_char_*>_> random_rows;
  undefined1 *local_58;
  
  this = PatternAddressMapper::get_code_jitter(mapper);
  PatternAddressMapper::randomize_addresses
            (mapper,fuzzing_params,&hammering_pattern.agg_access_patterns,true);
  auStack_b8 = (undefined1  [8])0x0;
  hammering_accesses_vec.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hammering_accesses_vec.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PatternAddressMapper::export_pattern
            (mapper,&hammering_pattern.aggressors,hammering_pattern.base_period,
             (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_b8);
  local_1468 = (undefined1  [8])(gen._M_x + 1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1468,"Aggressor ID to DRAM address mapping (bank, row, column):","");
  Logger::log_info((string *)local_1468,true);
  if (local_1468 != (undefined1  [8])(gen._M_x + 1)) {
    operator_delete((void *)local_1468,gen._M_x[1] + 1);
  }
  PatternAddressMapper::get_mapping_text_repr_abi_cxx11_((string *)local_1468,mapper);
  Logger::log_data((string *)local_1468,true);
  if (local_1468 != (undefined1  [8])(gen._M_x + 1)) {
    operator_delete((void *)local_1468,gen._M_x[1] + 1);
  }
  sync_each_ref = FuzzingParameterSet::get_random_sync_each_ref(fuzzing_params);
  iVar2 = FuzzingParameterSet::get_random_num_aggressors_for_sync(fuzzing_params);
  flipped_bits = CONCAT44(extraout_var,iVar2);
  local_1468 = (undefined1  [8])(gen._M_x + 1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1468,"Creating ASM code for hammering.","");
  Logger::log_info((string *)local_1468,true);
  if (local_1468 != (undefined1  [8])(gen._M_x + 1)) {
    operator_delete((void *)local_1468,gen._M_x[1] + 1);
  }
  iVar2 = FuzzingParameterSet::get_num_activations_per_t_refi(fuzzing_params);
  flushing = fuzzing_params->flushing_strategy;
  fencing = fuzzing_params->fencing_strategy;
  iVar3 = FuzzingParameterSet::get_hammering_total_num_activations(fuzzing_params);
  CodeJitter::jit_strict
            (this,iVar2,flushing,fencing,
             (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_b8,sync_each_ref,
             (int)flipped_bits,iVar3);
  local_98 = 0;
  if (num_dram_locations != 0) {
    lVar11 = 0;
    args_4 = 0;
    do {
      __position._M_current =
           (mapper->bit_flips).
           super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (mapper->bit_flips).
          super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
        ::_M_realloc_insert<>(&mapper->bit_flips,__position);
      }
      else {
        ((__position._M_current)->super__Vector_base<BitFlip,_std::allocator<BitFlip>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->super__Vector_base<BitFlip,_std::allocator<BitFlip>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position._M_current)->super__Vector_base<BitFlip,_std::allocator<BitFlip>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppvVar1 = &(mapper->bit_flips).
                   super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      local_27f8._0_8_ = local_27f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_27f8,
                 "Running pattern #%lu (%s) for address set %d (%s) at DRAM location #%ld.","");
      args_1 = hammering_pattern.instance_id._M_dataplus;
      args = cnt_generated_patterns;
      sVar6 = cnt_pattern_probes;
      psVar5 = PatternAddressMapper::get_instance_id_abi_cxx11_(mapper);
      format_string<unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
                ((string *)local_1468,(string *)local_27f8,args,args_1._M_p,sVar6,
                 (psVar5->_M_dataplus)._M_p,args_4);
      Logger::log_info((string *)local_1468,true);
      if (local_1468 != (undefined1  [8])(gen._M_x + 1)) {
        operator_delete((void *)local_1468,gen._M_x[1] + 1);
      }
      if ((undefined1 *)local_27f8._0_8_ != local_27f8 + 0x10) {
        operator_delete((void *)local_27f8._0_8_,local_27f8._16_8_ + 1);
      }
      iVar2 = FuzzingParameterSet::get_random_wait_until_start_hammering_us(fuzzing_params);
      FuzzingParameterSet::print_dynamic_parameters2(sync_each_ref,iVar2,(int)flipped_bits);
      auStack_88 = (undefined1  [8])0x0;
      random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (iVar2 < 1) {
        ppcVar12 = (pointer)0x0;
        local_58 = (undefined1 *)0x0;
        auVar10 = (undefined1  [8])0x0;
      }
      else {
        iVar3 = FuzzingParameterSet::get_max_row_no(fuzzing_params);
        PatternAddressMapper::get_random_nonaccessed_rows
                  ((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_1468,mapper,
                   iVar3);
        ppcVar12 = (pointer)gen._M_x[1];
        auVar10 = local_1468;
        auStack_88 = local_1468;
        local_58 = (undefined1 *)gen._M_x[0];
        random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)gen._M_x[0];
        random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)gen._M_x[1];
        do_random_accesses((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_88,
                           iVar2);
      }
      CodeJitter::hammer_pattern(this,fuzzing_params,true);
      sVar6 = Memory::check_memory(memory,mapper,false,true);
      lVar11 = lVar11 + sVar6;
      local_98 = lVar11;
      std::random_device::random_device((random_device *)local_27f8);
      uVar4 = std::random_device::_M_getval();
      local_1468 = (undefined1  [8])(ulong)uVar4;
      lVar9 = 1;
      puVar7 = (unsigned_long *)local_1468;
      do {
        puVar7 = (unsigned_long *)
                 (ulong)(((uint)((ulong)puVar7 >> 0x1e) ^ (uint)puVar7) * 0x6c078965 + (int)lVar9);
        gen._M_x[lVar9 + -1] = (unsigned_long)puVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x270);
      gen._M_x[0x26f] = 0x270;
      std::random_device::_M_fini();
      stack0xffffffffffffff24 = 0x2000000001;
      iVar2 = Range<int>::get_random_number
                        ((Range<int> *)((long)&gen._M_p + 4),(mt19937 *)local_1468);
      local_27f8._0_8_ = auStack_27c8;
      local_27f8._8_8_ = &DAT_00000001;
      local_27f8._16_8_ = (pointer)0x0;
      local_27f8._24_8_ = 0;
      local_27f8._32_8_ = 0x3f800000;
      local_27f8._40_8_ = 0;
      auStack_27c8[0] = 0;
      PatternAddressMapper::shift_mapping
                (mapper,iVar2,
                 (unordered_set<AggressorAccessPattern,_std::hash<AggressorAccessPattern>,_std::equal_to<AggressorAccessPattern>,_std::allocator<AggressorAccessPattern>_>
                  *)local_27f8);
      std::
      _Hashtable<AggressorAccessPattern,_AggressorAccessPattern,_std::allocator<AggressorAccessPattern>,_std::__detail::_Identity,_std::equal_to<AggressorAccessPattern>,_std::hash<AggressorAccessPattern>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<AggressorAccessPattern,_AggressorAccessPattern,_std::allocator<AggressorAccessPattern>,_std::__detail::_Identity,_std::equal_to<AggressorAccessPattern>,_std::hash<AggressorAccessPattern>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_27f8);
      args_4 = args_4 + 1;
      puVar7 = (unsigned_long *)auVar10;
      ppcVar13 = ppcVar12;
      if (args_4 < num_dram_locations) {
        if (auVar10 == (undefined1  [8])local_58) {
          iVar2 = FuzzingParameterSet::get_max_row_no(fuzzing_params);
          PatternAddressMapper::get_random_nonaccessed_rows
                    ((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_27f8,mapper,
                     iVar2);
          ppcVar13 = (pointer)local_27f8._16_8_;
          puVar7 = (unsigned_long *)local_27f8._0_8_;
          auStack_88 = (undefined1  [8])local_27f8._0_8_;
          random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_27f8._8_8_;
          random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_27f8._16_8_;
          local_27f8._0_8_ = (unsigned_long *)0x0;
          local_27f8._8_8_ = (pointer)0x0;
          local_27f8._16_8_ = (pointer)0x0;
          if ((local_58 != (undefined1 *)0x0) &&
             (operator_delete((void *)auVar10,(long)ppcVar12 - (long)local_58),
             (unsigned_long *)local_27f8._0_8_ != (unsigned_long *)0x0)) {
            operator_delete((void *)local_27f8._0_8_,local_27f8._16_8_ - local_27f8._0_8_);
          }
        }
        do_random_accesses((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_88,
                           64000);
      }
      if (puVar7 != (unsigned_long *)0x0) {
        operator_delete(puVar7,(long)ppcVar13 - (long)puVar7);
      }
    } while (args_4 != num_dram_locations);
  }
  p_Var8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            *)std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&map_pattern_mappings_bitflips_abi_cxx11_,
                           &hammering_pattern.instance_id);
  psVar5 = PatternAddressMapper::get_instance_id_abi_cxx11_(mapper);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string&,unsigned_long&>(p_Var8,psVar5,&local_98);
  CodeJitter::cleanup(this,(EVP_PKEY_CTX *)psVar5);
  if (auStack_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_b8,
                    (long)hammering_accesses_vec.
                          super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_b8);
  }
  return;
}

Assistant:

void FuzzyHammerer::probe_mapping_and_scan(PatternAddressMapper &mapper, Memory &memory,
                                           FuzzingParameterSet &fuzzing_params, size_t num_dram_locations) {

  // ATTENTION: This method uses the global variable hammering_pattern to refer to the pattern that is to be hammered

  CodeJitter &code_jitter = mapper.get_code_jitter();

  // randomize the aggressor ID -> DRAM row mapping
  mapper.randomize_addresses(fuzzing_params, hammering_pattern.agg_access_patterns, true);

  // now fill the pattern with these random addresses
  std::vector<volatile char *> hammering_accesses_vec;
  mapper.export_pattern(hammering_pattern.aggressors, hammering_pattern.base_period, hammering_accesses_vec);
  Logger::log_info("Aggressor ID to DRAM address mapping (bank, row, column):");
  Logger::log_data(mapper.get_mapping_text_repr());

  // now create instructions that follow this pattern (i.e., do jitting of code)
  bool sync_at_each_ref = fuzzing_params.get_random_sync_each_ref();
  int num_aggs_for_sync = fuzzing_params.get_random_num_aggressors_for_sync();
  Logger::log_info("Creating ASM code for hammering.");
  code_jitter.jit_strict(fuzzing_params.get_num_activations_per_t_refi(),
      fuzzing_params.flushing_strategy, fuzzing_params.fencing_strategy,
      hammering_accesses_vec, sync_at_each_ref, num_aggs_for_sync,
      fuzzing_params.get_hammering_total_num_activations());

  size_t flipped_bits = 0;
  for (size_t dram_location = 0; dram_location < num_dram_locations; ++dram_location) {
    mapper.bit_flips.emplace_back();

    Logger::log_info(format_string("Running pattern #%lu (%s) for address set %d (%s) at DRAM location #%ld.",
        cnt_generated_patterns,
        hammering_pattern.instance_id.c_str(),
        cnt_pattern_probes,
        mapper.get_instance_id().c_str(),
        dram_location));

    // wait for a random time before starting to hammer, while waiting access random rows that are not part of the
    // currently hammering pattern; this wait interval serves for two purposes: to reset the sampler and start from a
    // clean state before hammering, and also to fuzz a possible dependence at which REF we start hammering
    auto wait_until_hammering_us = fuzzing_params.get_random_wait_until_start_hammering_us();
    FuzzingParameterSet::print_dynamic_parameters2(sync_at_each_ref, wait_until_hammering_us, num_aggs_for_sync);

    std::vector<volatile char *> random_rows;
    if (wait_until_hammering_us > 0) {
      random_rows = mapper.get_random_nonaccessed_rows(fuzzing_params.get_max_row_no());
      do_random_accesses(random_rows, wait_until_hammering_us);
    }

    // do hammering
    code_jitter.hammer_pattern(fuzzing_params, true);

    // check if any bit flips happened
    flipped_bits += memory.check_memory(mapper, false, true);

    // now shift the mapping to another location
    std::mt19937 gen = std::mt19937(std::random_device()());
    mapper.shift_mapping(Range<int>(1,32).get_random_number(gen), {});

    if (dram_location + 1 < num_dram_locations) {
      // wait a bit and do some random accesses before checking reproducibility of the pattern
      if (random_rows.empty()) random_rows = mapper.get_random_nonaccessed_rows(fuzzing_params.get_max_row_no());
      do_random_accesses(random_rows, 64000); // 64ms (retention time)
    }
  }

  // store info about this bit flip (pattern ID, mapping ID, no. of bit flips)
  map_pattern_mappings_bitflips[hammering_pattern.instance_id].emplace(mapper.get_instance_id(), flipped_bits);

  // cleanup the jitter for its next use
  code_jitter.cleanup();
}